

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxflow.c
# Opt level: O0

void gomory_hu_tree_create(GomoryHuTree *tree,int32_t nnodes)

{
  int32_t *piVar1;
  flow_t *pfVar2;
  GomoryHuTreeAdjRow *pGVar3;
  int32_t nnodes_local;
  GomoryHuTree *tree_local;
  
  tree->nnodes = nnodes;
  piVar1 = (int32_t *)malloc((long)nnodes << 2);
  (tree->field_3).sink_candidate = piVar1;
  pfVar2 = (flow_t *)malloc((long)nnodes << 2);
  (tree->field_3).record_flows = pfVar2;
  pfVar2 = (flow_t *)malloc((long)(nnodes * nnodes) << 2);
  tree->maxflows = pfVar2;
  pGVar3 = (GomoryHuTreeAdjRow *)malloc((long)nnodes * 4 * (long)nnodes * 8);
  (tree->field_3).rows = pGVar3;
  piVar1 = (int32_t *)malloc((long)nnodes << 2);
  (tree->field_3).bfs_queue = piVar1;
  piVar1 = (int32_t *)malloc((long)nnodes << 2);
  (tree->field_3).parent = piVar1;
  piVar1 = (int32_t *)malloc((long)nnodes << 2);
  (tree->field_3).visited = piVar1;
  max_flow_result_create(&tree->temp_result,nnodes);
  return;
}

Assistant:

void gomory_hu_tree_create(GomoryHuTree *tree, int32_t nnodes) {
    tree->nnodes = nnodes;
    tree->sink_candidate = malloc(nnodes * sizeof(*tree->sink_candidate));
    tree->record_flows = malloc(nnodes * sizeof(*tree->record_flows));
    tree->maxflows = malloc(nnodes * nnodes * sizeof(*tree->maxflows));
    tree->rows = malloc(nnodes * sizeof(tree->rows[0]) * nnodes *
                        sizeof(tree->rows[0].records[0]));

    tree->bfs_queue = malloc(nnodes * sizeof(*tree->bfs_queue));
    tree->parent = malloc(nnodes * sizeof(*tree->parent));
    tree->visited = malloc(nnodes * sizeof(*tree->visited));

    max_flow_result_create(&tree->temp_result, nnodes);
}